

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

double zeta(double p)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  if (p <= 1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"ZETA - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Exponent P <= 1.0.\n");
    exit(1);
  }
  dVar4 = 0.0;
  uVar2 = 0;
  do {
    dVar3 = pow((double)(int)(uVar2 + 1),p);
    dVar3 = 1.0 / dVar3 + dVar4;
    if (0x3e6 < uVar2) {
      return dVar3;
    }
    bVar1 = dVar4 < dVar3;
    dVar4 = dVar3;
    uVar2 = uVar2 + 1;
  } while (bVar1);
  return dVar3;
}

Assistant:

BURKHARDT_EXPORT
double zeta ( double p )

//****************************************************************************80
//
//  Purpose:
//
//    ZETA estimates the Riemann Zeta function.
//
//  Definition:
//
//    For 1 < P, the Riemann Zeta function is defined as:
//
//      ZETA ( P ) = Sum ( 1 <= N < +oo ) 1 / N^P
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    25 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996.
//
//  Parameters:
//
//    Input, double P, the power to which the integers are raised.
//    P must be greater than 1.  
//
//    Output, double ZETA, an approximation to the Riemann
//    Zeta function.
//
{
  int n;
  double value;
  double value_old;

  if ( p <= 1.0 )
  {
    std::cerr << "\n";
    std::cerr << "ZETA - Fatal error!\n";
    std::cerr << "  Exponent P <= 1.0.\n";
    exit ( 1 );
  }

  value = 0.0;
  n = 0;

  for ( ; ; )
  {
    n = n + 1;
    value_old = value;
    value = value + 1.0 / pow ( double(n), p );

    if ( value <= value_old || 1000 <= n )
    {
      break;
    }

  }

  return value;
}